

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcSymbol * __thiscall
CTcPrsSymtab::find_noref(CTcPrsSymtab *this,textchar_t *sym,size_t len,CTcPrsSymtab **symtab)

{
  int iVar1;
  undefined4 extraout_var;
  CTcSymbol *unaff_R12;
  CTcPrsSymtab *curtab;
  CTcSymbol *pCVar2;
  
  while( true ) {
    iVar1 = (*this->_vptr_CTcPrsSymtab[2])(this,sym,len);
    pCVar2 = (CTcSymbol *)CONCAT44(extraout_var,iVar1);
    if (pCVar2 != (CTcSymbol *)0x0) {
      unaff_R12 = pCVar2;
    }
    if (pCVar2 != (CTcSymbol *)0x0 && symtab != (CTcPrsSymtab **)0x0) {
      *symtab = this;
      unaff_R12 = pCVar2;
    }
    if (pCVar2 != (CTcSymbol *)0x0) break;
    this = this->parent_;
    if (this == (CTcPrsSymtab *)0x0) {
      return (CTcSymbol *)0x0;
    }
  }
  return unaff_R12;
}

Assistant:

CTcSymbol *CTcPrsSymtab::find_noref(const textchar_t *sym, size_t len,
                                    CTcPrsSymtab **symtab)
{
    /*
     *   Look for the symbol.  Start in the current symbol table, and work
     *   outwards to the outermost enclosing table.  
     */
    for (CTcPrsSymtab *curtab = this ; curtab != 0 ;
         curtab = curtab->get_parent())
    {
        /* look for the symbol in this table */
        CTcSymbol *entry = curtab->find_direct(sym, len);
        if (entry != 0)
        {
            /* 
             *   found it - if the caller wants to know about the symbol
             *   table in which we actually found the symbol, return that
             *   information 
             */
            if (symtab != 0)
                *symtab = curtab;

            /* return the symbol table entry we found */
            return entry;
        }
    }

    /* we didn't find the symbol - return failure */
    return 0;
}